

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O3

void Diffusion::setDomainBC
               (array<amrex::LinOpBCType,_3UL> *mlmg_lobc,array<amrex::LinOpBCType,_3UL> *mlmg_hibc,
               BCRec *bc)

{
  long lVar1;
  int idim;
  long lVar2;
  uint uVar3;
  LinOpBCType LVar4;
  array<amrex::LinOpBCType,_3UL> *paVar5;
  
  lVar1 = **(long **)(DAT_0071a208 + -8);
  lVar2 = 0;
  do {
    if (*(char *)(lVar1 + 0x51 + lVar2) == '\x01') {
      mlmg_hibc->_M_elems[lVar2] = Periodic;
      LVar4 = Periodic;
      paVar5 = mlmg_lobc;
    }
    else {
      uVar3 = bc->bc[lVar2] + 1;
      LVar4 = bogus;
      if (uVar3 < 6) {
        LVar4 = *(LinOpBCType *)(&DAT_006676e0 + (ulong)uVar3 * 4);
      }
      mlmg_lobc->_M_elems[lVar2] = LVar4;
      LVar4 = Neumann;
      paVar5 = mlmg_hibc;
      switch(bc->bc[lVar2 + 3]) {
      default:
        LVar4 = bogus;
        break;
      case 1:
      case 2:
      case 4:
        break;
      case 3:
        LVar4 = Dirichlet;
        break;
      case -1:
        LVar4 = reflect_odd;
      }
    }
    paVar5->_M_elems[lVar2] = LVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return;
}

Assistant:

void
Diffusion::setDomainBC (std::array<LinOpBCType,AMREX_SPACEDIM>& mlmg_lobc,
                            std::array<LinOpBCType,AMREX_SPACEDIM>& mlmg_hibc,
                            const BCRec& bc)
{

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
      // DefaultGeometry() is same as parent->Geom(0)
      if (DefaultGeometry().isPeriodic(idim))
        {
            mlmg_lobc[idim] = mlmg_hibc[idim] = LinOpBCType::Periodic;
        }
        else
        {
            int pbc = bc.lo(idim);
            if (pbc == EXT_DIR)
            {
                mlmg_lobc[idim] = LinOpBCType::Dirichlet;
            }
            else if (pbc == FOEXTRAP      ||
                     pbc == HOEXTRAP      ||
                     pbc == REFLECT_EVEN)
            {
                mlmg_lobc[idim] = LinOpBCType::Neumann;
            }
            else if (pbc == REFLECT_ODD)
            {
                mlmg_lobc[idim] = LinOpBCType::reflect_odd;
            }
            else
            {
                mlmg_lobc[idim] = LinOpBCType::bogus;
            }

            pbc = bc.hi(idim);
            if (pbc == EXT_DIR)
            {
                mlmg_hibc[idim] = LinOpBCType::Dirichlet;
            }
            else if (pbc == FOEXTRAP      ||
                     pbc == HOEXTRAP      ||
                     pbc == REFLECT_EVEN)
            {
                mlmg_hibc[idim] = LinOpBCType::Neumann;
            }
            else if (pbc == REFLECT_ODD)
            {
                mlmg_hibc[idim] = LinOpBCType::reflect_odd;
            }
            else
            {
                mlmg_hibc[idim] = LinOpBCType::bogus;
            }
        }
    }
}